

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O0

void pager::create(string *fileName)

{
  size_t sVar1;
  reference pvVar2;
  allocator<unsigned_char> local_69;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  allocator<char> local_39;
  string local_38 [32];
  r_file local_18;
  r_file f;
  string *fileName_local;
  
  f._f = (FILE *)fileName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"w+",&local_39);
  r_file::open(&local_18,(char *)fileName,(int)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  sVar1 = block_size();
  std::allocator<unsigned_char>::allocator(&local_69);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,sVar1,&local_69);
  std::allocator<unsigned_char>::~allocator(&local_69);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
  sVar1 = block_size();
  memset(pvVar2,0,sVar1);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
  pvVar2[0] = '\x01';
  pvVar2[1] = '\0';
  pvVar2[2] = '\0';
  pvVar2[3] = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,4);
  pvVar2[0] = '\0';
  pvVar2[1] = '\0';
  pvVar2[2] = '\0';
  pvVar2[3] = '\0';
  pvVar2[4] = '\0';
  pvVar2[5] = '\0';
  pvVar2[6] = '\0';
  pvVar2[7] = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
  sVar1 = block_size();
  block_write_file<unsigned_char,r_file>(pvVar2,sVar1,&local_18,0x1000);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  r_file::~r_file(&local_18);
  return;
}

Assistant:

void pager::create(const std::string& fileName)
{
    auto f = r_file::open(fileName, "w+");

    vector<uint8_t> block(pager::block_size());

    memset(&block[0], 0, pager::block_size());
    *(uint32_t*)&block[0] = 1;
    *(uint64_t*)&block[4] = 0;

    block_write_file(&block[0], pager::block_size(), f);
}